

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_table_entry.cpp
# Opt level: O1

unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true> __thiscall
duckdb::DuckTableEntry::RemoveColumn
          (DuckTableEntry *this,ClientContext *context,RemoveColumnInfo *info)

{
  __node_base *__ht;
  size_type *this_00;
  SchemaCatalogEntry *pSVar1;
  Catalog *pCVar2;
  bool bVar3;
  bool bVar4;
  LogicalIndex LVar5;
  CreateTableInfo *this_01;
  pointer pCVar6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_02;
  __node_base_ptr p_Var7;
  Binder *pBVar8;
  type create_info_00;
  ColumnDefinition *pCVar9;
  type pBVar10;
  DuckTableEntry *pDVar11;
  LogicalIndex LVar12;
  size_type sVar13;
  type __args_1;
  CatalogException *pCVar14;
  RemoveColumnInfo *in_RCX;
  __hash_code __code;
  idx_t iVar15;
  pointer pLVar16;
  ColumnListIterator CVar17;
  templated_unique_single_t create_info;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_create_info;
  vector<duckdb::LogicalIndex,_true> adjusted_indices;
  LogicalIndex removed_index;
  shared_ptr<duckdb::DataTable,_true> new_storage;
  shared_ptr<duckdb::Binder,_true> binder;
  logical_index_set_t removed_columns;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  bound_constraints;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_208;
  undefined1 local_200 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e8;
  undefined1 local_1e0 [32];
  _Head_base<0UL,_duckdb::CatalogEntry_*,_false> local_1c0;
  undefined1 local_1b8 [16];
  LogicalIndex local_1a8;
  __node_base local_1a0;
  _Alloc_hider local_198;
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [32];
  float local_150;
  Val local_148;
  ColumnDependencyManager *local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_128;
  __node_base local_110;
  undefined1 local_108 [216];
  
  local_1c0._M_head_impl = (CatalogEntry *)this;
  local_198._M_p = (pointer)info;
  LVar5 = TableCatalogEntry::GetColumnIndex
                    ((TableCatalogEntry *)context,&in_RCX->removed_column,in_RCX->if_column_exists);
  local_1a8 = LVar5;
  if (LVar5.index == 0xffffffffffffffff) {
    if (in_RCX->if_column_exists == false) {
      pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_170._0_8_ = (long)local_170 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,"Cannot drop column: rowid column cannot be dropped","");
      CatalogException::CatalogException(pCVar14,(string *)local_170);
      __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    (local_1c0._M_head_impl)->_vptr_CatalogEntry = 0;
  }
  else {
    pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
    local_1a0._M_nxt = (_Hash_node_base *)in_RCX;
    this_01 = (CreateTableInfo *)operator_new(0x1d8);
    local_170._0_8_ = (long)local_170 + 0x10U;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_170,*(long *)&context->interrupted,
               (long)&(((context->registered_state).
                        super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
                        .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl
                       )->lock).super___mutex_base._M_mutex + *(long *)&context->interrupted);
    CreateTableInfo::CreateTableInfo(this_01,pSVar1,(string *)local_170);
    local_208._M_head_impl = this_01;
    if (local_170._0_8_ != (long)local_170 + 0x10U) {
      operator_delete((void *)local_170._0_8_);
    }
    bVar3 = *(bool *)((long)&(context->config).home_directory._M_string_length + 1);
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_208);
    (pCVar6->super_CreateInfo).temporary = bVar3;
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_208);
    Value::operator=(&(pCVar6->super_CreateInfo).comment,
                     (Value *)((long)&(context->config).home_directory.field_2 + 8));
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_208);
    __ht = &(context->config).profiler_settings._M_h._M_before_begin;
    this_02 = &(pCVar6->super_CreateInfo).tags;
    if ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)__ht != this_02) {
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_02,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)__ht);
    }
    local_170._0_8_ = &local_148.hugeint.upper;
    local_170._8_8_ = &DAT_00000001;
    local_170._16_8_ = (_Hash_node_base *)0x0;
    local_170._24_8_ = (_Hash_node_base *)0x0;
    local_150 = 1.0;
    local_148.bigint = 0;
    local_148.hugeint.upper = 0;
    this_00 = &(context->config).user_variables._M_h._M_element_count;
    bVar3 = ColumnDependencyManager::HasDependents((ColumnDependencyManager *)this_00,LVar5);
    if (bVar3) {
      local_1e0._0_8_ = LVar5;
      p_Var7 = ::std::
               _Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<duckdb::LogicalIndex,_std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>,_std::allocator<std::pair<const_duckdb::LogicalIndex,_std::unordered_set<duckdb::LogicalIndex,_duckdb::LogicalIndexHashFunction,_std::equal_to<duckdb::LogicalIndex>,_std::allocator<duckdb::LogicalIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)this_00,
                          LVar5.index %
                          *(ulong *)&(context->config).user_variables._M_h._M_rehash_policy,
                          (key_type *)local_1e0,LVar5.index);
      if ((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)(p_Var7->_M_nxt + 2) !=
          (_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)local_170) {
        ::std::
        _Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_assign_elements<std::_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
                  ((_Hashtable<duckdb::LogicalIndex,duckdb::LogicalIndex,std::allocator<duckdb::LogicalIndex>,std::__detail::_Identity,std::equal_to<duckdb::LogicalIndex>,duckdb::LogicalIndexHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_170,
                   (_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)(p_Var7->_M_nxt + 2));
      }
    }
    if (((_Hash_node_base *)local_170._24_8_ != (_Hash_node_base *)0x0) &&
       ((bool)(((CatalogEntryMap *)(local_1a0._M_nxt + 0x13))->entries)._M_t._M_impl.field_0x1 ==
        false)) {
      pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_1e0._0_8_ = local_1e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,
                 "Cannot drop column: column is a dependency of 1 or more generated column(s)","");
      CatalogException::CatalogException(pCVar14,(string *)local_1e0);
      __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_1b8._8_8_ = &(context->config).asof_loop_join_threshold;
    CVar17 = ColumnList::Logical((ColumnList *)local_1b8._8_8_);
    LVar5.index = local_1a8.index;
    local_1e0._0_8_ = CVar17.list;
    local_1e0[8] = CVar17.physical;
    if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      local_1e0._24_8_ =
           ((long)(((ColumnList *)local_1e0._0_8_)->columns).
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(((ColumnList *)local_1e0._0_8_)->columns).
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      local_1e0._24_8_ =
           (long)(((ColumnList *)local_1e0._0_8_)->physical_columns).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(((ColumnList *)local_1e0._0_8_)->physical_columns).
                 super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3;
    }
    local_1e0._16_8_ = (pointer)0x0;
    if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pLVar16 = (pointer)(((long)(((ColumnList *)local_1e0._0_8_)->columns).
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 .
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(((ColumnList *)local_1e0._0_8_)->columns).
                                 super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 .
                                 super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3) *
                         -0x7b425ed097b425ed);
    }
    else {
      pLVar16 = (pointer)((long)(((ColumnList *)local_1e0._0_8_)->physical_columns).
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)(((ColumnList *)local_1e0._0_8_)->physical_columns).
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3);
    }
    if (((undefined1  [16])CVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      iVar15 = ((long)(((ColumnList *)local_1e0._0_8_)->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(((ColumnList *)local_1e0._0_8_)->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      iVar15 = (long)(((ColumnList *)local_1e0._0_8_)->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(((ColumnList *)local_1e0._0_8_)->physical_columns).
                     super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
    }
    local_138 = (ColumnDependencyManager *)this_00;
    if ((pLVar16 == (pointer)0x0) && (local_1e0._24_8_ == iVar15)) {
      bVar3 = false;
    }
    else {
      bVar3 = false;
      local_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_;
      do {
        pCVar9 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                           ((ColumnLogicalIteratorInternal *)local_1e0);
        LVar12 = ColumnDefinition::Logical(pCVar9);
        if (LVar12.index == LVar5.index) {
LAB_01582f87:
          bVar4 = ColumnDefinition::Generated(pCVar9);
          if (bVar4) {
            bVar3 = true;
          }
        }
        else {
          local_128.
          super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ColumnDefinition::Logical(pCVar9);
          sVar13 = ::std::
                   _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::count((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                            *)local_170,(key_type *)&local_128);
          if (sVar13 != 0) goto LAB_01582f87;
          pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                   ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                                 *)&local_208);
          ColumnDefinition::Copy((ColumnDefinition *)local_108,pCVar9);
          ColumnList::AddColumn(&pCVar6->columns,(ColumnDefinition *)local_108);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_108 + 0xa0));
          Value::~Value((Value *)(local_108 + 0x60));
          if ((ParsedExpression *)local_108._88_8_ != (ParsedExpression *)0x0) {
            (**(code **)&((((__uniq_ptr_data<duckdb::Binding,_std::default_delete<duckdb::Binding>,_true,_true>
                             *)&((BaseExpression *)local_108._88_8_)->_vptr_BaseExpression)->
                          super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>
                          )._M_t.
                          super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>
                          .super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl)->
                         binding_type)();
          }
          local_108._88_8_ =
               (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                )0x0;
          LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_);
          }
        }
        local_1e0._16_8_ = local_1e0._16_8_ + 1;
      } while ((((pointer)local_1e0._16_8_ != pLVar16) || (local_1e0._24_8_ != iVar15)) ||
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e0._0_8_ != local_130._M_pi));
    }
    pCVar6 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_208);
    LVar5.index = local_1a8.index;
    if ((pCVar6->columns).columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pCVar6->columns).columns.
        super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      pCVar14 = (CatalogException *)__cxa_allocate_exception(0x10);
      local_1e0._0_8_ = local_1e0 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e0,"Cannot drop column: table only has one column remaining!","");
      CatalogException::CatalogException(pCVar14,(string *)local_1e0);
      __cxa_throw(pCVar14,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ColumnDependencyManager::RemoveColumn
              ((vector<duckdb::LogicalIndex,_true> *)local_1e0,local_138,local_1a8,
               ((long)((context->config).streaming_buffer_size -
                      (context->config).asof_loop_join_threshold) >> 3) * -0x7b425ed097b425ed);
    Binder::CreateBinder
              ((Binder *)local_180,(ClientContext *)local_198._M_p,
               (optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER);
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_180);
    Binder::BindConstraints
              ((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)&local_128,pBVar8,
               (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                *)&(context->config).set_variables._M_h._M_rehash_policy._M_next_resize,
               (string *)&context->interrupted,(ColumnList *)local_1b8._8_8_);
    create_info_00 =
         unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
         operator*((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                    *)&local_208);
    UpdateConstraintsOnColumnDrop
              ((DuckTableEntry *)context,&local_1a8,(vector<duckdb::LogicalIndex,_true> *)local_1e0,
               (RemoveColumnInfo *)local_1a0._M_nxt,create_info_00,
               (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                *)&local_128,bVar3);
    pBVar8 = shared_ptr<duckdb::Binder,_true>::operator->
                       ((shared_ptr<duckdb::Binder,_true> *)local_180);
    local_1b8._0_8_ = local_208._M_head_impl;
    local_208._M_head_impl = (CreateTableInfo *)0x0;
    Binder::BindCreateTableInfo
              ((Binder *)local_200,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               pBVar8,(SchemaCatalogEntry *)local_1b8);
    if ((CreateTableInfo *)local_1b8._0_8_ != (CreateTableInfo *)0x0) {
      (*(((CreateInfo *)local_1b8._0_8_)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    local_1b8._0_8_ = (__node_base_ptr)0x0;
    pCVar9 = ColumnList::GetColumn((ColumnList *)local_1b8._8_8_,LVar5);
    bVar3 = ColumnDefinition::Generated(pCVar9);
    if (bVar3) {
      pCVar2 = (Catalog *)(context->config).max_expression_depth;
      pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar10 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                             *)local_200);
      pDVar11 = (DuckTableEntry *)operator_new(0x298);
      local_200._16_8_ = (context->config).user_variables._M_h._M_bucket_count;
      local_1e8._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (context->config).user_variables._M_h._M_before_begin._M_nxt;
      if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_1e8._M_pi)->_M_use_count = (local_1e8._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_1e8._M_pi)->_M_use_count = (local_1e8._M_pi)->_M_use_count + 1;
        }
      }
      DuckTableEntry(pDVar11,pCVar2,pSVar1,pBVar10,
                     (shared_ptr<duckdb::DataTable,_true> *)(local_200 + 0x10));
      if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
      }
      (local_1c0._M_head_impl)->_vptr_CatalogEntry = (_func_int **)pDVar11;
    }
    else {
      __args_1 = shared_ptr<duckdb::DataTable,_true>::operator*
                           ((shared_ptr<duckdb::DataTable,_true> *)
                            &(context->config).user_variables._M_h._M_bucket_count);
      local_110._M_nxt =
           (_Hash_node_base *)ColumnList::LogicalToPhysical((ColumnList *)local_1b8._8_8_,LVar5);
      local_200._16_8_ = (ClientContext *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<duckdb::DataTable,std::allocator<duckdb::DataTable>,duckdb::ClientContext&,duckdb::DataTable&,unsigned_long>
                (&local_1e8,(DataTable **)(local_200 + 0x10),
                 (allocator<duckdb::DataTable> *)(local_200 + 0xf),(ClientContext *)local_198._M_p,
                 __args_1,(unsigned_long *)&local_110);
      shared_ptr<duckdb::DataTable,_true>::shared_ptr
                ((shared_ptr<duckdb::DataTable,_true> *)local_190,
                 (shared_ptr<duckdb::DataTable> *)(local_200 + 0x10));
      if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
      }
      pCVar2 = (Catalog *)(context->config).max_expression_depth;
      pSVar1 = *(SchemaCatalogEntry **)&(context->config).query_verification_enabled;
      pBVar10 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                             *)local_200);
      pDVar11 = (DuckTableEntry *)operator_new(0x298);
      local_200._16_8_ = local_190._0_8_;
      local_1e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)(local_190._8_8_ + 8) = *(_Atomic_word *)(local_190._8_8_ + 8) + 1;
        }
      }
      DuckTableEntry(pDVar11,pCVar2,pSVar1,pBVar10,
                     (shared_ptr<duckdb::DataTable,_true> *)(local_200 + 0x10));
      if (local_1e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e8._M_pi);
      }
      (local_1c0._M_head_impl)->_vptr_CatalogEntry = (_func_int **)pDVar11;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_190._8_8_);
      }
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         )local_200._0_8_ != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_200,
                 (BoundCreateTableInfo *)local_200._0_8_);
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector(&local_128);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_180._8_8_);
    }
    if ((ColumnList *)local_1e0._0_8_ != (ColumnList *)0x0) {
      operator_delete((void *)local_1e0._0_8_);
    }
    ::std::
    _Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<duckdb::LogicalIndex,_duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>,_std::__detail::_Identity,_std::equal_to<duckdb::LogicalIndex>,_duckdb::LogicalIndexHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_170);
    if (local_208._M_head_impl != (CreateTableInfo *)0x0) {
      (*((local_208._M_head_impl)->super_CreateInfo).super_ParseInfo._vptr_ParseInfo[1])();
    }
  }
  return (unique_ptr<duckdb::CatalogEntry,_std::default_delete<duckdb::CatalogEntry>,_true>)
         local_1c0._M_head_impl;
}

Assistant:

unique_ptr<CatalogEntry> DuckTableEntry::RemoveColumn(ClientContext &context, RemoveColumnInfo &info) {
	auto removed_index = GetColumnIndex(info.removed_column, info.if_column_exists);
	if (!removed_index.IsValid()) {
		if (!info.if_column_exists) {
			throw CatalogException("Cannot drop column: rowid column cannot be dropped");
		}
		return nullptr;
	}

	auto create_info = make_uniq<CreateTableInfo>(schema, name);
	create_info->temporary = temporary;
	create_info->comment = comment;
	create_info->tags = tags;

	logical_index_set_t removed_columns;
	if (column_dependency_manager.HasDependents(removed_index)) {
		removed_columns = column_dependency_manager.GetDependents(removed_index);
	}
	if (!removed_columns.empty() && !info.cascade) {
		throw CatalogException("Cannot drop column: column is a dependency of 1 or more generated column(s)");
	}
	bool dropped_column_is_generated = false;
	for (auto &col : columns.Logical()) {
		if (col.Logical() == removed_index || removed_columns.count(col.Logical())) {
			if (col.Generated()) {
				dropped_column_is_generated = true;
			}
			continue;
		}
		create_info->columns.AddColumn(col.Copy());
	}
	if (create_info->columns.empty()) {
		throw CatalogException("Cannot drop column: table only has one column remaining!");
	}
	auto adjusted_indices = column_dependency_manager.RemoveColumn(removed_index, columns.LogicalColumnCount());

	auto binder = Binder::CreateBinder(context);
	auto bound_constraints = binder->BindConstraints(constraints, name, columns);

	UpdateConstraintsOnColumnDrop(removed_index, adjusted_indices, info, *create_info, bound_constraints,
	                              dropped_column_is_generated);

	auto bound_create_info = binder->BindCreateTableInfo(std::move(create_info), schema);
	if (columns.GetColumn(LogicalIndex(removed_index)).Generated()) {
		return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, storage);
	}
	auto new_storage =
	    make_shared_ptr<DataTable>(context, *storage, columns.LogicalToPhysical(LogicalIndex(removed_index)).index);
	return make_uniq<DuckTableEntry>(catalog, schema, *bound_create_info, new_storage);
}